

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

RawSchema ** __thiscall
kj::Vector<capnp::_::RawSchema*>::add<capnp::_::RawSchema*&>
          (Vector<capnp::_::RawSchema*> *this,RawSchema **params)

{
  bool bVar1;
  RawSchema **ppRVar2;
  RawSchema **params_local;
  Vector<capnp::_::RawSchema_*> *this_local;
  
  bVar1 = ArrayBuilder<capnp::_::RawSchema_*>::isFull((ArrayBuilder<capnp::_::RawSchema_*> *)this);
  if (bVar1) {
    Vector<capnp::_::RawSchema_*>::grow((Vector<capnp::_::RawSchema_*> *)this,0);
  }
  ppRVar2 = fwd<capnp::_::RawSchema*&>(params);
  ppRVar2 = ArrayBuilder<capnp::_::RawSchema*>::add<capnp::_::RawSchema*&>
                      ((ArrayBuilder<capnp::_::RawSchema*> *)this,ppRVar2);
  return ppRVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }